

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O0

void drmp3_L3_stereo_top_band(float *right,drmp3_uint8 *sfb,int nbands,int *max_band)

{
  int local_30;
  int local_2c;
  int k;
  int i;
  int *max_band_local;
  int nbands_local;
  drmp3_uint8 *sfb_local;
  float *right_local;
  
  max_band[2] = -1;
  max_band[1] = -1;
  *max_band = -1;
  local_2c = 0;
  sfb_local = (drmp3_uint8 *)right;
  do {
    if (nbands <= local_2c) {
      return;
    }
    for (local_30 = 0; local_30 < (int)(uint)sfb[local_2c]; local_30 = local_30 + 2) {
      if ((*(float *)(sfb_local + (long)local_30 * 4) != 0.0) ||
         (NAN(*(float *)(sfb_local + (long)local_30 * 4)))) {
LAB_00125015:
        max_band[local_2c % 3] = local_2c;
        break;
      }
      if ((*(float *)(sfb_local + (long)(local_30 + 1) * 4) != 0.0) ||
         (NAN(*(float *)(sfb_local + (long)(local_30 + 1) * 4)))) goto LAB_00125015;
    }
    sfb_local = sfb_local + (long)(int)(uint)sfb[local_2c] * 4;
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

static void drmp3_L3_stereo_top_band(const float *right, const drmp3_uint8 *sfb, int nbands, int max_band[3])
{
    int i, k;

    max_band[0] = max_band[1] = max_band[2] = -1;

    for (i = 0; i < nbands; i++)
    {
        for (k = 0; k < sfb[i]; k += 2)
        {
            if (right[k] != 0 || right[k + 1] != 0)
            {
                max_band[i % 3] = i;
                break;
            }
        }
        right += sfb[i];
    }
}